

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O0

int frame_type_qdelta(AV1_COMP *cpi,int q)

{
  RATE_FACTOR_LEVEL RVar1;
  int iVar2;
  GF_GROUP *gf_group_00;
  undefined4 in_ESI;
  long *in_RDI;
  double rate_factor;
  int arf_layer;
  FRAME_TYPE frame_type;
  RATE_FACTOR_LEVEL rf_lvl;
  GF_GROUP *gf_group;
  int local_2c;
  undefined2 in_stack_ffffffffffffffe4;
  undefined4 in_stack_fffffffffffffff0;
  
  gf_group_00 = (GF_GROUP *)(*in_RDI + 400);
  RVar1 = get_rate_factor_level(gf_group_00,(uint)*(byte *)(in_RDI + 0xe258));
  if (gf_group_00->layer_depth[*(byte *)(in_RDI + 0xe258)] < 6) {
    local_2c = gf_group_00->layer_depth[*(byte *)(in_RDI + 0xe258)];
  }
  else {
    local_2c = 6;
  }
  iVar2 = av1_compute_qdelta_by_rate
                    ((AV1_COMP *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                     (FRAME_TYPE)((ulong)gf_group_00 >> 0x38),(int)gf_group_00,
                     (double)CONCAT17(RVar1,CONCAT16(gf_group_00->frame_type
                                                     [*(byte *)(in_RDI + 0xe258)],
                                                     CONCAT24(in_stack_ffffffffffffffe4,local_2c))))
  ;
  return iVar2;
}

Assistant:

static int frame_type_qdelta(const AV1_COMP *cpi, int q) {
  const GF_GROUP *const gf_group = &cpi->ppi->gf_group;
  const RATE_FACTOR_LEVEL rf_lvl =
      get_rate_factor_level(gf_group, cpi->gf_frame_index);
  const FRAME_TYPE frame_type = gf_group->frame_type[cpi->gf_frame_index];
  const int arf_layer = AOMMIN(gf_group->layer_depth[cpi->gf_frame_index], 6);
  const double rate_factor =
      (rf_lvl == INTER_NORMAL) ? 1.0 : arf_layer_deltas[arf_layer];

  return av1_compute_qdelta_by_rate(cpi, frame_type, q, rate_factor);
}